

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O3

void __thiscall CTestGen9Resource_TestMSAA_Test::TestBody(CTestGen9Resource_TestMSAA_Test *this)

{
  int iVar1;
  _Tuple_impl<5UL,_int> _Var2;
  double dVar3;
  double dVar4;
  bool bVar5;
  CTestGen9Resource_TestMSAA_Test *pCVar6;
  pointer ptVar7;
  CTestGen9Resource_TestMSAA_Test *pCVar8;
  long lVar9;
  GMM_RESOURCE_INFO *pGVar10;
  long lVar11;
  TEST_MSAA MSAA;
  int iVar12;
  uint uVar13;
  pointer ptVar14;
  undefined1 auVar15 [8];
  int iVar16;
  ulong ExpectedValue;
  long lVar17;
  uint uVar18;
  uint32_t uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 auStack_148 [8];
  vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
  List;
  GMM_RESCREATE_PARAMS local_108;
  ulong local_88;
  ulong local_80;
  uint32_t local_74;
  uint local_70;
  uint32_t ExpectedMCSBpp;
  double local_68;
  CTestGen9Resource_TestMSAA_Test *local_60;
  uint32_t local_58;
  uint32_t local_54;
  uint32_t MCSHAlign;
  uint32_t MCSVAlign;
  uint32_t VAlign;
  uint32_t TileDimY;
  uint32_t local_40;
  TEST_TILE_TYPE local_3c;
  uint32_t HAlign;
  byte local_31;
  uint32_t TileDimX;
  
  local_40 = 0;
  MCSHAlign = 0;
  HAlign = 0;
  MCSVAlign = 0;
  local_58 = 0;
  local_54 = 0;
  auStack_148 = (undefined1  [8])0x0;
  List.
  super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  List.
  super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  BuildInputIterator((vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                      *)auStack_148,4,2,false);
  ptVar7 = List.
           super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar8 = this;
  auVar15 = auStack_148;
  uVar22 = local_88;
  pCVar6 = local_60;
  do {
    local_60 = pCVar8;
    if (auVar15 == (undefined1  [8])ptVar7) {
      if (auStack_148 != (undefined1  [8])0x0) {
        local_88 = uVar22;
        local_60 = pCVar6;
        operator_delete((void *)auStack_148);
      }
      return;
    }
    _Var2.super__Head_base<5UL,_int,_false>._M_head_impl =
         (((pointer)auVar15)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
         super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.
         super__Tuple_impl<2UL,_int,_bool,_int,_int>.super__Tuple_impl<3UL,_bool,_int,_int>.
         super__Tuple_impl<4UL,_int,_int>.super__Tuple_impl<5UL,_int>.
         super__Head_base<5UL,_int,_false>;
    lVar9 = (long)(((pointer)auVar15)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
                  super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.
                  super__Tuple_impl<2UL,_int,_bool,_int,_int>.super__Tuple_impl<3UL,_bool,_int,_int>
                  .super__Tuple_impl<4UL,_int,_int>.super__Head_base<4UL,_int,_false>._M_head_impl;
    local_31 = (((pointer)auVar15)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
               super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.
               super__Tuple_impl<2UL,_int,_bool,_int,_int>.super__Tuple_impl<3UL,_bool,_int,_int>.
               super__Head_base<3UL,_bool,_false>._M_head_impl;
    uVar13 = (((pointer)auVar15)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
             super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.super__Head_base<1UL,_int,_false>.
             _M_head_impl;
    local_88 = (ulong)uVar13;
    local_3c = (((pointer)auVar15)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
               super__Head_base<0UL,_int,_false>._M_head_impl;
    ExpectedMCSBpp = 0xfffff000;
    if (local_3c == TEST_TILEYS) {
      ExpectedMCSBpp = 0xffff0000;
    }
    local_108.pPreallocatedResInfo = (GMM_RESOURCE_INFO *)0x0;
    local_108.MultiTileArch._0_1_ = 0;
    local_108.MultiTileArch.GpuVaMappingSet = '\0';
    local_108.MultiTileArch.LocalMemEligibilitySet = '\0';
    local_108.MultiTileArch.LocalMemPreferredSet = '\0';
    local_108.MultiTileArch.Reserved = 0;
    local_108.ExistingSysMemSize = 0;
    local_108.MaximumRenamingListLength = 0;
    local_108.NoGfxMemory = '\0';
    local_108._109_3_ = 0;
    local_108.RotateInfo = 0;
    local_108._84_4_ = 0;
    local_108.pExistingSysMem = 0;
    local_108.MaxLod = 0;
    local_108.ArraySize = 0;
    local_108.BaseAlignment = 0;
    local_108.OverridePitch = 0;
    local_108.field_6.BaseWidth64 = 0;
    local_108.BaseHeight = 0;
    local_108.Depth = 0;
    local_108.MSAA.NumSamples = 0;
    local_108.Usage = GMM_RESOURCE_USAGE_UNKNOWN;
    local_108.CpTag = 0;
    local_108._44_4_ = 0;
    local_108.Flags.Info = (anon_struct_8_44_94931171_for_Info)0x0;
    local_108.Flags.Wa = (anon_struct_4_14_9f1eeba6_for_Wa)0x0;
    local_108.MSAA.SamplePattern = GMM_MSAA_DISABLED;
    local_108.Type = RESOURCE_INVALID;
    local_108.Format = GMM_FORMAT_INVALID;
    local_108.Flags.Gpu = (anon_struct_8_45_9b07292e_for_Gpu)0x0;
    if (((int)local_3c < 4 &&
         (((pointer)auVar15)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
         super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.
         super__Tuple_impl<2UL,_int,_bool,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl
         == 1) &&
       ((uVar21 = 0x800000, (local_31 & 1) != 0 ||
        ((local_3c != TEST_TILEX && (uVar21 = 0x40, uVar13 - 1 < 2)))))) {
      CTestResource::SetTileFlag((CTestResource *)this,&local_108,local_3c);
      local_108.Flags.Gpu =
           (anon_struct_8_45_9b07292e_for_Gpu)
           ((ulong)local_108.Flags.Gpu & 0xffffffffff7fffbf | uVar21);
      local_108.ArraySize =
           *(uint32_t *)
            (&DAT_001a38c0 + (long)(int)_Var2.super__Head_base<5UL,_int,_false>._M_head_impl * 4);
      local_108.NoGfxMemory = '\x01';
      local_108.Format = GMM_FORMAT_INVALID;
      if ((uint)local_88 < 5) {
        local_108.Format = (&DAT_001a7f2c)[local_88];
      }
      local_108.Type = RESOURCE_2D;
      local_68 = (double)(long)local_88;
      local_80 = 0xfff;
      if (local_3c == TEST_TILEYS) {
        local_80 = 0xffff;
      }
      uVar21 = ~local_80;
      ptVar14 = (pointer)0x1;
      local_70 = local_31 & 1;
      do {
        MSAA = (TEST_MSAA)ptVar14;
        CTestResource::GetAlignmentAndTileDimensionsForMSAA
                  ((CTestResource *)this,(TEST_BPP)local_88,SUB41(local_70,0),local_3c,MSAA,&HAlign,
                   &MCSVAlign,&local_40,&MCSHAlign,&local_74,&local_58,&local_54);
        local_108.field_6.BaseWidth = HAlign * *(int *)(&DAT_001a38a0 + lVar9 * 8) + 1;
        local_108.field_6.BaseWidth64._4_4_ = 0;
        local_108.Depth = 1;
        local_108.BaseHeight = MCSVAlign * *(int *)(&DAT_001a38a4 + lVar9 * 8) + 1;
        dVar3 = exp2((double)(int)MSAA);
        local_108.MSAA.NumSamples = (uint32_t)(long)dVar3;
        local_108.Flags.Gpu =
             (anon_struct_8_45_9b07292e_for_Gpu)((ulong)local_108.Flags.Gpu & 0xffffffffffff7fff);
        pGVar10 = (GMM_RESOURCE_INFO *)
                  (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                            (CommonULT::pGmmULTClientContext,&local_108);
        _VAlign = pGVar10;
        if (pGVar10 != (GMM_RESOURCE_INFO *)0x0) {
          CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,pGVar10,local_40);
          CTestResource::VerifyResourceVAlign<true>((CTestResource *)this,pGVar10,MCSHAlign);
          List.
          super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = ptVar14;
          if ((local_31 & 1) == 0) {
            switch(MSAA) {
            case MSAA_2x:
              lVar17 = 2;
              bVar5 = false;
              break;
            case MSAA_4x:
              bVar5 = true;
              lVar17 = 2;
              break;
            case MSAA_8x:
              bVar5 = true;
              lVar17 = 4;
              ptVar14 = (pointer)0x2;
              break;
            case MSAA_16x:
              bVar5 = true;
              lVar17 = 4;
              break;
            default:
              iVar12 = 1;
              lVar17 = 1;
              uVar19 = local_108.BaseHeight;
              goto LAB_0016bc37;
            }
            iVar12 = (int)ptVar14;
            local_108.field_6.BaseWidth64 = local_108.field_6.BaseWidth64 + 1 & 0xfffffffffffffffe;
            uVar19 = local_108.BaseHeight + 1 & 0xfffffffe;
            if (!bVar5) {
              iVar12 = 1;
              uVar19 = local_108.BaseHeight;
            }
LAB_0016bc37:
            local_108.BaseHeight = uVar19;
            lVar11 = local_108.field_6.BaseWidth64 * lVar17;
            uVar18 = local_40 - 1;
            dVar3 = exp2(local_68);
            uVar20 = HAlign - 1;
            iVar16 = (int)lVar17 * local_108.field_6.BaseWidth;
            iVar1 = local_40 - 1;
            uVar13 = -local_40;
            dVar4 = exp2(local_68);
            pCVar6 = local_60;
            uVar22 = ((ulong)uVar20 +
                     ((long)dVar3 & 0xffffffffU) * (~(ulong)uVar18 & lVar11 + (ulong)uVar18)) -
                     (ulong)((int)(long)dVar4 * (uVar13 & iVar1 + iVar16) + -1 + HAlign & HAlign - 1
                            );
            CTestResource::VerifyResourcePitch<true>
                      ((CTestResource *)local_60,_VAlign,(uint32_t)uVar22);
            if (local_3c != TEST_LINEAR) {
              CTestResource::VerifyResourcePitchInTiles<true>
                        ((CTestResource *)pCVar6,_VAlign,
                         (uint32_t)((uVar22 & 0xffffffff) / (ulong)HAlign));
            }
            ExpectedValue = (ulong)(-MCSHAlign & (MCSHAlign - 1) + iVar12 * local_108.BaseHeight);
            if (1 < local_108.ArraySize) {
              CTestResource::VerifyResourceQPitch<true>
                        ((CTestResource *)local_60,_VAlign,ExpectedValue);
            }
            this = local_60;
            CTestResource::VerifyResourceSize<true>
                      ((CTestResource *)local_60,_VAlign,
                       (uVar22 & 0xffffffff) *
                       (~(ulong)(MCSVAlign - 1) &
                       local_108.ArraySize * ExpectedValue + (ulong)(MCSVAlign - 1)) + local_80 &
                       uVar21);
          }
          else {
            uVar13 = (local_40 - 1) + local_108.field_6.BaseWidth;
            uVar18 = -local_40;
            dVar3 = exp2(local_68);
            iVar12 = (int)(long)dVar3 * (uVar18 & uVar13) + HAlign;
            uVar13 = (local_40 - 1) + local_108.field_6.BaseWidth;
            uVar18 = -local_40;
            dVar3 = exp2(local_68);
            uVar19 = ~((int)(long)dVar3 * (uVar18 & uVar13) + -1 + HAlign & HAlign - 1) + iVar12;
            CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar10,uVar19);
            if (local_3c != TEST_LINEAR) {
              CTestResource::VerifyResourcePitchInTiles<true>
                        ((CTestResource *)this,_VAlign,uVar19 / HAlign);
            }
            uVar13 = -MCSHAlign & (local_108.BaseHeight - 1) + MCSHAlign;
            if (1 < local_108.ArraySize) {
              CTestResource::VerifyResourceQPitch<true>((CTestResource *)this,_VAlign,(ulong)uVar13)
              ;
            }
            CTestResource::VerifyResourceSize<true>
                      ((CTestResource *)this,_VAlign,
                       (ulong)((-MCSVAlign &
                               (MCSVAlign - 1) +
                               uVar13 * local_108.MSAA.NumSamples * local_108.ArraySize) * uVar19 +
                               (int)local_80 & ExpectedMCSBpp));
          }
          local_108.Flags.Gpu =
               (anon_struct_8_45_9b07292e_for_Gpu)((ulong)local_108.Flags.Gpu | 0x8000);
          pGVar10 = (GMM_RESOURCE_INFO *)
                    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                              (CommonULT::pGmmULTClientContext,&local_108);
          CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,pGVar10,local_58);
          CTestResource::VerifyResourceVAlign<true>((CTestResource *)this,pGVar10,local_54);
          uVar13 = (-local_58 & (local_58 - 1) + local_108.field_6.BaseWidth) * local_74 + 0x7f;
          uVar18 = uVar13 & 0xffffff80;
          CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar10,uVar18);
          CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar10,uVar13 >> 7)
          ;
          uVar13 = -local_54 & (local_108.BaseHeight - 1) + local_54;
          if (1 < local_108.ArraySize) {
            CTestResource::VerifyResourceQPitch<true>
                      ((CTestResource *)local_60,pGVar10,(ulong)uVar13);
          }
          this = local_60;
          CTestResource::VerifyResourceSize<true>
                    ((CTestResource *)local_60,pGVar10,
                     (ulong)((local_108.ArraySize * uVar13 + 0x1f & 0xffffffe0) * uVar18));
          ptVar14 = List.
                    super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
                    (CommonULT::pGmmULTClientContext,pGVar10);
        }
        (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
                  (CommonULT::pGmmULTClientContext,_VAlign);
        uVar13 = (int)ptVar14 + 1;
        ptVar14 = (pointer)(ulong)uVar13;
        uVar22 = local_88;
      } while (uVar13 != 5);
    }
    local_88 = uVar22;
    auVar15 = (undefined1  [8])((long)auVar15 + 0x18);
    pCVar8 = local_60;
    uVar22 = local_88;
    pCVar6 = local_60;
  } while( true );
}

Assistant:

TEST_F(CTestGen9Resource, TestMSAA)
{
    //Tile dimensions in Bytes
    const uint32_t MCSTileSize[1][2] = {128, 32}; //MCS is TileY

    //Gen9: MSAA 16x no MCS for width > 8K
    //No MSAA for YUV/compressed formats
    //Interleaved MSS (IMS) for Depth/Stencil. Arrayed MSS (CMS) for Color RT
    //MSS (Arrayed): px_wL, px_hL = pixel width/height of single sample at Lod L
    //  MSS width = px_wL, MSS height = NumSamples*px_hL
    //MSS (Interleaved): px_wL, px_hL = pixel width/height of single sample at Lod L
    // Samples         MSS width                MSS Height
    //   2x            4*ceil(px_wL/2)             px_hL
    //   4x            4*ceil(px_wL/2)           4*ceil(px_hL/2)
    //   8x            8*ceil(px_wL/2)           4*ceil(px_hL/2)
    //  16x            8*ceil(px_wL/2)           8*ceil(px_hL/2)
    //MCS (bpp): 2x/4x - bpp_8, 8x - bpp_32, 16x - bpp_64

    const uint32_t TestDimensions[4][2] = {
    //Input dimensions in #Tiles
    {15, 20}, //16 Tiles x 20 <Max Width: Depth MSS crosses Pitch limit beyond this>
    {0, 0},   //1x1x1
    {1, 0},   //2 Tilesx1
    {1, 1},   //2 Tiles x 2
    };

    uint32_t TestArraySize[2] = {1, 5};

    uint32_t HAlign = 0, VAlign = 0, TileDimX = 0, TileDimY = 0;
    uint32_t MCSHAlign = 0, MCSVAlign = 0, TileSize = 0;
    uint32_t ExpectedMCSBpp;
    std::vector<tuple<int, int, int, bool, int, int>> List; //TEST_TILE_TYPE, TEST_BPP, TEST_RESOURCE_TYPE, Depth or RT, TestDimension index, ArraySize
    auto Size = BuildInputIterator(List, 4, 2, false);             // Size of arrays TestDimensions, TestArraySize

    for(auto element : List)
    {
        GMM_RESCREATE_PARAMS gmmParams = {};
        gmmParams.Flags.Info           = {0};

        TEST_TILE_TYPE     Tiling     = (TEST_TILE_TYPE)std::get<0>(element);
        TEST_BPP           Bpp        = (TEST_BPP)std::get<1>(element);
        TEST_RESOURCE_TYPE ResType    = (TEST_RESOURCE_TYPE)std::get<2>(element);
        bool               IsRT       = std::get<3>(element); // True for RT, False for Depth
        int                TestDimIdx = std::get<4>(element); //index into TestDimensions array
        int                ArrayIdx   = std::get<5>(element); //index into TestArraySize
        TileSize                      = (Tiling == TEST_TILEYS) ? GMM_KBYTE(64) : GMM_KBYTE(4);

        //Discard un-supported Tiling/Res_type/bpp for this test
        if(ResType != TEST_RESOURCE_2D || Tiling >= TEST_TILEYF         //No 1D/3D/Cube. Supported 2D mip-maps/array
           || (!IsRT && (Tiling == TEST_TILEX ||
                         !(Bpp == TEST_BPP_16 || Bpp == TEST_BPP_32)))) //depth supported on 16bit, 32bit formats only
            continue;

        SetTileFlag(gmmParams, Tiling);
        SetResType(gmmParams, ResType);
        SetResGpuFlags(gmmParams, IsRT);
        SetResArraySize(gmmParams, TestArraySize[ArrayIdx]);

        gmmParams.NoGfxMemory = 1;
        gmmParams.Format      = SetResourceFormat(Bpp);
        for(uint32_t k = MSAA_2x; k <= MSAA_16x; k++)
        {
            GetAlignmentAndTileDimensionsForMSAA(Bpp, IsRT, Tiling, (TEST_MSAA)k,
                                                 TileDimX, TileDimY, HAlign, VAlign,
                                                 ExpectedMCSBpp, MCSHAlign, MCSVAlign);

            gmmParams.BaseWidth64     = TestDimensions[TestDimIdx][0] * TileDimX + 0x1;
            gmmParams.BaseHeight      = TestDimensions[TestDimIdx][1] * TileDimY + 0x1;
            gmmParams.Depth           = 0x1;
            gmmParams.MSAA.NumSamples = static_cast<uint32_t>(pow((double)2, k));
            gmmParams.Flags.Gpu.MCS   = 0;

            //MSS surface
            GMM_RESOURCE_INFO *MSSResourceInfo;
            MSSResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

            if(MSSResourceInfo)
            {
                VerifyResourceHAlign<true>(MSSResourceInfo, HAlign);
                VerifyResourceVAlign<true>(MSSResourceInfo, VAlign);
                if(IsRT) //Arrayed MSS
                {
                    uint32_t ExpectedPitch = 0, ExpectedQPitch = 0;
                    ExpectedPitch = GMM_ULT_ALIGN(GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign) * (uint32_t)pow(2.0, Bpp), TileDimX); // Aligned width * bpp, aligned to TileWidth
                    VerifyResourcePitch<true>(MSSResourceInfo, ExpectedPitch);
                    if(Tiling != TEST_LINEAR)
                        VerifyResourcePitchInTiles<true>(MSSResourceInfo, ExpectedPitch / TileDimX);

                    ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight, VAlign);
                    if(gmmParams.ArraySize > 1) //Gen9: Qpitch is distance between array slices (not sample slices)
                    {
                        VerifyResourceQPitch<true>(MSSResourceInfo, ExpectedQPitch);
                    }

                    uint32_t ExpectedHeight = GMM_ULT_ALIGN(ExpectedQPitch * gmmParams.MSAA.NumSamples * gmmParams.ArraySize, TileDimY); //Align Height =ExpectedPitch * NumSamples * ExpectedQPitch, to Tile-Height
                    VerifyResourceSize<true>(MSSResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * ExpectedHeight, TileSize));
                }
                else // Interleaved MSS
                {
                    uint32_t WidthMultiplier, HeightMultiplier;
                    GetInterleaveMSSPattern((TEST_MSAA)k, WidthMultiplier, HeightMultiplier, IsRT, Bpp);
                    gmmParams.BaseWidth64 = WidthMultiplier > 1 ? GMM_ULT_ALIGN(gmmParams.BaseWidth64, 2) : gmmParams.BaseWidth64;
                    gmmParams.BaseHeight  = HeightMultiplier > 1 ? GMM_ULT_ALIGN(gmmParams.BaseHeight, 2) : gmmParams.BaseHeight;

                    uint32_t ExpectedPitch = GMM_ULT_ALIGN(GMM_ULT_ALIGN(gmmParams.BaseWidth64 * WidthMultiplier, HAlign) * (uint32_t)pow(2.0, Bpp), TileDimX);
                    VerifyResourcePitch<true>(MSSResourceInfo, ExpectedPitch);
                    if(Tiling != TEST_LINEAR)
                    {
                        VerifyResourcePitchInTiles<true>(MSSResourceInfo, ExpectedPitch / TileDimX);
                    }

                    uint64_t ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight * HeightMultiplier, VAlign);
                    if(gmmParams.ArraySize > 1)
                    {
                        VerifyResourceQPitch<true>(MSSResourceInfo, ExpectedQPitch);
                    }
                    uint64_t ExpectedHeight = GMM_ULT_ALIGN(ExpectedQPitch * gmmParams.ArraySize, TileDimY);            //Align Height = ExpectedQPitch*ArraySize, to Tile-Height
                    VerifyResourceSize<true>(MSSResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * ExpectedHeight, TileSize)); //ExpectedPitch *ExpectedHeight
                }
            }

            //No MCS surface if MSS creation failed
            if(MSSResourceInfo)
            {
                gmmParams.Flags.Gpu.MCS = 1;
                GMM_RESOURCE_INFO *MCSResourceInfo;
                MCSResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

                VerifyResourceHAlign<true>(MCSResourceInfo, MCSHAlign);
                VerifyResourceVAlign<true>(MCSResourceInfo, MCSVAlign);

                uint32_t ExpectedPitch = GMM_ULT_ALIGN(GMM_ULT_ALIGN(gmmParams.BaseWidth64, MCSHAlign) * ExpectedMCSBpp, MCSTileSize[0][0]); // Align in texels, tehn multiply w/ Bpt
                VerifyResourcePitch<true>(MCSResourceInfo, ExpectedPitch);
                VerifyResourcePitchInTiles<true>(MCSResourceInfo, ExpectedPitch / MCSTileSize[0][0]);

                uint32_t ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight, MCSVAlign);
                if(gmmParams.ArraySize > 1)
                {
                    ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight, MCSVAlign); //QPitch only for array
                    VerifyResourceQPitch<true>(MCSResourceInfo, ExpectedQPitch);
                }

                uint32_t ExpectedHeight = GMM_ULT_ALIGN(ExpectedQPitch * gmmParams.ArraySize, MCSTileSize[0][1]);
                VerifyResourceSize<true>(MCSResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * ExpectedHeight, GMM_KBYTE(4))); //MCS Tile is TileY

                pGmmULTClientContext->DestroyResInfoObject(MCSResourceInfo);
            } //MCS

            pGmmULTClientContext->DestroyResInfoObject(MSSResourceInfo);
        } //NumSamples = k
    }     //Iterate through all Input types

    //Mip-mapped, MSAA case:
}